

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O2

monster * group_monster_tracking(chunk_conflict *c,monster *mon)

{
  _Bool _Var1;
  monster *pmVar2;
  monster_group *pmVar3;
  
  pmVar3 = c->monster_groups[mon->group_info[0].index];
  do {
    do {
      pmVar3 = (monster_group *)pmVar3->member_list;
      if (pmVar3 == (monster_group *)0x0) {
        return (monster *)0x0;
      }
      pmVar2 = cave_monster(c,pmVar3->index);
    } while (pmVar2 == mon);
    _Var1 = flag_has_dbg(pmVar2->mflag,2,10,"tracker->mflag","MFLAG_TRACKING");
  } while ((!_Var1) ||
          (_Var1 = flag_has_dbg(pmVar2->mflag,2,2,"tracker->mflag","MFLAG_ACTIVE"), !_Var1));
  return pmVar2;
}

Assistant:

struct monster *group_monster_tracking(struct chunk *c,
									   const struct monster *mon)
{
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	while (entry) {
		struct monster *tracker = cave_monster(c, entry->midx);
		if (tracker != mon &&
				mflag_has(tracker->mflag, MFLAG_TRACKING) &&
				mflag_has(tracker->mflag, MFLAG_ACTIVE)) {
			return tracker;
		}
		entry = entry->next;
	}

	return NULL;
}